

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

CScriptCheck * __thiscall CScriptCheck::operator=(CScriptCheck *this,CScriptCheck *param_2)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  ScriptError SVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  CAmount CVar8;
  CTxOut *in_RSI;
  CScriptCheck *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::operator=(in_RSI,&in_RDI->m_tx_out);
  in_RDI->m_signature_cache =
       *(SignatureCache **)((long)&in_RSI[1].scriptPubKey.super_CScriptBase._union + 0x18);
  CVar8 = in_RSI[1].nValue;
  uVar2 = *(undefined4 *)((long)&in_RSI[1].nValue + 4);
  uVar3 = *(uint *)&in_RSI[1].scriptPubKey.super_CScriptBase._union;
  uVar4 = *(uint *)((long)&in_RSI[1].scriptPubKey.super_CScriptBase._union + 4);
  SVar5 = *(ScriptError *)((long)&in_RSI[1].scriptPubKey.super_CScriptBase._union + 0xc);
  uVar6 = *(undefined4 *)((long)&in_RSI[1].scriptPubKey.super_CScriptBase._union + 0x10);
  uVar7 = *(undefined4 *)((long)&in_RSI[1].scriptPubKey.super_CScriptBase._union + 0x14);
  *(size_type *)&in_RDI->cacheStore =
       in_RSI[1].scriptPubKey.super_CScriptBase._union.indirect_contents.capacity;
  in_RDI->error = SVar5;
  *(undefined4 *)&in_RDI->txdata = uVar6;
  *(undefined4 *)((long)&in_RDI->txdata + 4) = uVar7;
  *(int *)&in_RDI->ptxTo = (int)CVar8;
  *(undefined4 *)((long)&in_RDI->ptxTo + 4) = uVar2;
  in_RDI->nIn = uVar3;
  in_RDI->nFlags = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CScriptCheck& operator=(CScriptCheck&&) = default;